

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_print.c
# Opt level: O0

int ASN1_PRINTABLE_type(uchar *s,int max)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  byte *pbVar7;
  int t61;
  int ia5;
  int c;
  int local_14;
  byte *local_10;
  int local_4;
  
  bVar3 = false;
  bVar2 = false;
  if (s == (uchar *)0x0) {
    local_4 = 0x13;
  }
  else {
    local_14 = max;
    local_10 = s;
    if (max < 0) {
      sVar5 = strlen((char *)s);
      local_14 = (int)sVar5;
      local_10 = s;
    }
    while (iVar6 = local_14 + -1, 0 < local_14) {
      pbVar7 = local_10 + 1;
      bVar1 = *local_10;
      iVar4 = ossl_ctype_check((uint)bVar1,0x800);
      if (iVar4 == 0) {
        bVar3 = true;
      }
      local_14 = iVar6;
      local_10 = pbVar7;
      if ((bVar1 & 0x80) != 0) {
        bVar2 = true;
      }
    }
    if (bVar2) {
      local_4 = 0x14;
    }
    else if (bVar3) {
      local_4 = 0x16;
    }
    else {
      local_4 = 0x13;
    }
  }
  return local_4;
}

Assistant:

int ASN1_PRINTABLE_type(const unsigned char *s, int len)
{
    int c;
    int ia5 = 0;
    int t61 = 0;

    if (s == NULL)
        return V_ASN1_PRINTABLESTRING;

    if (len < 0)
        len = strlen((const char *)s);

    while (len-- > 0) {
        c = *(s++);
        if (!ossl_isasn1print(c))
            ia5 = 1;
        if (!ossl_isascii(c))
            t61 = 1;
    }
    if (t61)
        return V_ASN1_T61STRING;
    if (ia5)
        return V_ASN1_IA5STRING;
    return V_ASN1_PRINTABLESTRING;
}